

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsParallel.h
# Opt level: O2

void __thiscall highs::parallel::TaskGroup::~TaskGroup(TaskGroup *this)

{
  cancel(this);
  taskWait(this);
  return;
}

Assistant:

~TaskGroup() {
    cancel();
    taskWait();
  }